

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::report_query(XmlReporter *this,QueryData *in)

{
  bool bVar1;
  reporterMap *prVar2;
  ScopedElement *pSVar3;
  ScopedElement *pSVar4;
  char *file;
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [32];
  undefined1 local_350 [16];
  string local_340 [39];
  allocator local_319;
  string local_318 [32];
  undefined1 local_2f8 [16];
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  undefined1 local_2a0 [16];
  uint i_1;
  allocator local_269;
  string local_268 [32];
  undefined1 local_248 [16];
  string local_238 [32];
  char *local_218;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [16];
  uint i;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  undefined1 local_f0 [16];
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr_1;
  iterator __end3_1;
  iterator __begin3_1;
  reporterMap *__range3_1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [16];
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  *curr;
  iterator __end3;
  iterator __begin3;
  reporterMap *__range3;
  QueryData *in_local;
  XmlReporter *this_local;
  
  (*(this->super_IReporter)._vptr_IReporter[1])();
  if ((this->opt->list_reporters & 1U) == 0) {
    if (((this->opt->count & 1U) == 0) && ((this->opt->list_test_cases & 1U) == 0)) {
      if ((this->opt->list_test_suites & 1U) != 0) {
        for (local_2a0._8_4_ = 0; (uint)local_2a0._8_4_ < in->num_data;
            local_2a0._8_4_ = local_2a0._8_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2c0,"TestSuite",&local_2c1);
          XmlWriter::scopedElement((XmlWriter *)local_2a0,(string *)&this->xml);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e8,"name",(allocator *)(local_2f8 + 0xf));
          (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                    ((ScopedElement *)local_2a0,(string *)local_2e8,
                     &in->data[(uint)local_2a0._8_4_]->m_test_suite);
          std::__cxx11::string::~string(local_2e8);
          std::allocator<char>::~allocator((allocator<char> *)(local_2f8 + 0xf));
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2a0);
          std::__cxx11::string::~string(local_2c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"OverallResultsTestCases",&local_319);
        XmlWriter::scopedElement((XmlWriter *)local_2f8,(string *)&this->xml);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_340,"unskipped",(allocator *)(local_350 + 0xf));
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  ((ScopedElement *)local_2f8,(string *)local_340,
                   &in->run_stats->numTestCasesPassingFilters);
        std::__cxx11::string::~string(local_340);
        std::allocator<char>::~allocator((allocator<char> *)(local_350 + 0xf));
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2f8);
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_370,"OverallResultsTestSuites",&local_371);
        XmlWriter::scopedElement((XmlWriter *)local_350,(string *)&this->xml);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_398,"unskipped",&local_399);
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  ((ScopedElement *)local_350,(string *)local_398,
                   &in->run_stats->numTestSuitesPassingFilters);
        std::__cxx11::string::~string(local_398);
        std::allocator<char>::~allocator((allocator<char> *)&local_399);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_350);
        std::__cxx11::string::~string(local_370);
        std::allocator<char>::~allocator((allocator<char> *)&local_371);
      }
    }
    else {
      for (local_170._8_4_ = 0; (uint)local_170._8_4_ < in->num_data;
          local_170._8_4_ = local_170._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_190,"TestCase",&local_191);
        XmlWriter::scopedElement((XmlWriter *)local_170,(string *)&this->xml);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b8,"name",&local_1b9);
        pSVar4 = (ScopedElement *)
                 (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                           ((ScopedElement *)local_170,(string *)local_1b8,
                            &in->data[(uint)local_170._8_4_]->m_name);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e0,"testsuite",&local_1e1);
        pSVar4 = (ScopedElement *)
                 (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                           (pSVar4,(string *)local_1e0,
                            &in->data[(uint)local_170._8_4_]->m_test_suite);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"filename",&local_209);
        file = String::c_str(&in->data[(uint)local_170._8_4_]->m_file);
        local_218 = skipPathFromFilename(file);
        pSVar3 = (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                           (pSVar4,(string *)local_208,&local_218);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_238,"line",(allocator *)(local_248 + 0xf));
        local_248._8_4_ = line(this,in->data[(uint)local_170._8_4_]->m_line);
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  (pSVar3,(string *)local_238,(uint *)(local_248 + 8));
        std::__cxx11::string::~string(local_238);
        std::allocator<char>::~allocator((allocator<char> *)(local_248 + 0xf));
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_170);
        std::__cxx11::string::~string(local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"OverallResultsTestCases",&local_269);
      XmlWriter::scopedElement((XmlWriter *)local_248,(string *)&this->xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i_1,"unskipped",(allocator *)(local_2a0 + 0xf));
      XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                ((ScopedElement *)local_248,(string *)&i_1,
                 &in->run_stats->numTestCasesPassingFilters);
      std::__cxx11::string::~string((string *)&i_1);
      std::allocator<char>::~allocator((allocator<char> *)(local_2a0 + 0xf));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_248);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
    }
  }
  else {
    prVar2 = getListeners();
    __end3 = std::
             map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
             ::begin(prVar2);
    curr = (pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
            *)std::
              map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
              ::end(prVar2);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&curr), bVar1) {
      local_40._8_8_ =
           std::
           _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
           ::operator*(&__end3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Listener",&local_61);
      XmlWriter::scopedElement((XmlWriter *)local_40,(string *)&this->xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"priority",&local_99);
      pSVar3 = XmlWriter::ScopedElement::writeAttribute<int>
                         ((ScopedElement *)local_40,(string *)local_98,(int *)local_40._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"name",(allocator *)((long)&__range3_1 + 7));
      XmlWriter::ScopedElement::writeAttribute<doctest::String>
                (pSVar3,(string *)local_c0,&((pair<int,_doctest::String> *)local_40._8_8_)->second);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_40);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
      ::operator++(&__end3);
    }
    prVar2 = getReporters();
    __end3_1 = std::
               map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
               ::begin(prVar2);
    curr_1 = (pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
              *)std::
                map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
                ::end(prVar2);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&curr_1), bVar1) {
      local_f0._8_8_ =
           std::
           _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
           ::operator*(&__end3_1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Reporter",&local_111);
      XmlWriter::scopedElement((XmlWriter *)local_f0,(string *)&this->xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"priority",&local_139);
      pSVar3 = XmlWriter::ScopedElement::writeAttribute<int>
                         ((ScopedElement *)local_f0,(string *)local_138,(int *)local_f0._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i,"name",(allocator *)(local_170 + 0xf));
      XmlWriter::ScopedElement::writeAttribute<doctest::String>
                (pSVar3,(string *)&i,&((pair<int,_doctest::String> *)local_f0._8_8_)->second);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)(local_170 + 0xf));
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_f0);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>
      ::operator++(&__end3_1);
    }
  }
  XmlWriter::endElement(&this->xml);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            test_run_start();
            if(opt.list_reporters) {
                for(auto& curr : getListeners())
                    xml.scopedElement("Listener")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
                for(auto& curr : getReporters())
                    xml.scopedElement("Reporter")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
            } else if(opt.count || opt.list_test_cases) {
                for(unsigned i = 0; i < in.num_data; ++i) {
                    xml.scopedElement("TestCase").writeAttribute("name", in.data[i]->m_name)
                        .writeAttribute("testsuite", in.data[i]->m_test_suite)
                        .writeAttribute("filename", skipPathFromFilename(in.data[i]->m_file.c_str()))
                        .writeAttribute("line", line(in.data[i]->m_line));
                }
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
            } else if(opt.list_test_suites) {
                for(unsigned i = 0; i < in.num_data; ++i)
                    xml.scopedElement("TestSuite").writeAttribute("name", in.data[i]->m_test_suite);
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
                xml.scopedElement("OverallResultsTestSuites")
                        .writeAttribute("unskipped", in.run_stats->numTestSuitesPassingFilters);
            }
            xml.endElement();
        }